

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O3

expr_node * __thiscall expr_tree::tanDeriv(expr_tree *this,expr_node *node)

{
  expr_node *this_00;
  expr_node *peVar1;
  expr_node *this_01;
  expr_node *_right;
  expr_value eStack_28;
  
  this_00 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,4);
  expr_node::expr_node(this_00,'\x05',&eStack_28);
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,1);
  expr_node::expr_node(peVar1,'\x01',&eStack_28);
  this_00->left = peVar1;
  this_01 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,5);
  expr_node::expr_node(this_01,'\x05',&eStack_28);
  this_00->right = this_01;
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,10);
  expr_node::expr_node(peVar1,'\x05',&eStack_28);
  this_01->left = peVar1;
  _right = Copy(node->right);
  peVar1 = this_01->left;
  peVar1->right = _right;
  Link(peVar1,(expr_node *)0x0,_right);
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,2);
  expr_node::expr_node(peVar1,'\x01',&eStack_28);
  this_01->right = peVar1;
  Link(this_01,this_01->left,peVar1);
  Link(this_00,this_00->left,this_00->right);
  return this_00;
}

Assistant:

expr_node* expr_tree::tanDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)DIV);
    deriv->left = new expr_node(INT, (long)1);
    deriv->right = new expr_node(OP, (long)PWR);
    auto square = deriv->right;
    square->left = new expr_node(OP, (long)COS);
    square->left->right = Copy(node->right);
    Link(square->left, nullptr, square->left->right);
    square->right = new expr_node(INT, (long)2);
    Link(square, square->left, square->right);
    Link(deriv, deriv->left, deriv->right);
    return deriv;
}